

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLAttribute * __thiscall tinyxml2::XMLElement::FindOrCreateAttribute(XMLElement *this,char *name)

{
  bool bVar1;
  char *p;
  XMLAttribute *local_28;
  XMLAttribute *attrib;
  XMLAttribute *last;
  char *name_local;
  XMLElement *this_local;
  
  attrib = (XMLAttribute *)0x0;
  for (local_28 = this->_rootAttribute; local_28 != (XMLAttribute *)0x0; local_28 = local_28->_next)
  {
    p = XMLAttribute::Name(local_28);
    bVar1 = XMLUtil::StringEqual(p,name,0x7fffffff);
    if (bVar1) break;
    attrib = local_28;
  }
  if (local_28 == (XMLAttribute *)0x0) {
    local_28 = (XMLAttribute *)
               MemPoolT<72>::Alloc(&((this->super_XMLNode)._document)->_attributePool);
    XMLAttribute::XMLAttribute(local_28);
    local_28->_memPool = &(((this->super_XMLNode)._document)->_attributePool).super_MemPool;
    if (attrib == (XMLAttribute *)0x0) {
      this->_rootAttribute = local_28;
    }
    else {
      attrib->_next = local_28;
    }
    XMLAttribute::SetName(local_28,name);
    (*local_28->_memPool->_vptr_MemPool[5])();
  }
  return local_28;
}

Assistant:

XMLAttribute* XMLElement::FindOrCreateAttribute( const char* name )
{
    XMLAttribute* last = 0;
    XMLAttribute* attrib = 0;
    for( attrib = _rootAttribute;
            attrib;
            last = attrib, attrib = attrib->_next ) {
        if ( XMLUtil::StringEqual( attrib->Name(), name ) ) {
            break;
        }
    }
    if ( !attrib ) {
        TIXMLASSERT( sizeof( XMLAttribute ) == _document->_attributePool.ItemSize() );
        attrib = new (_document->_attributePool.Alloc() ) XMLAttribute();
        attrib->_memPool = &_document->_attributePool;
        if ( last ) {
            last->_next = attrib;
        }
        else {
            _rootAttribute = attrib;
        }
        attrib->SetName( name );
        attrib->_memPool->SetTracked(); // always created and linked.
    }
    return attrib;
}